

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O0

Hop_Man_t * Abc_NtkHaigReconstruct(Hop_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  Hop_Obj_t *pHVar4;
  Hop_Obj_t *pHVar5;
  Hop_Obj_t *p1;
  int local_2c;
  int Counter;
  int i;
  Hop_Obj_t *pObj;
  Hop_Man_t *pNew;
  Hop_Man_t *p_local;
  
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar2 = Vec_PtrEntry(p->vObjs,local_2c);
    *(undefined8 *)((long)pvVar2 + 8) = 0;
  }
  p_local = Hop_ManStart();
  pVVar3 = Vec_PtrAlloc(p->nCreated);
  p_local->vObjs = pVVar3;
  pVVar3 = p_local->vObjs;
  pHVar4 = Hop_ManConst1(p_local);
  Vec_PtrPush(pVVar3,pHVar4);
  pHVar4 = Hop_ManConst1(p_local);
  pHVar5 = Hop_ManConst1(p);
  (pHVar5->field_1).pNext = pHVar4;
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vPis), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar2 = Vec_PtrEntry(p->vPis,local_2c);
    pHVar4 = Hop_ObjCreatePi(p_local);
    *(Hop_Obj_t **)((long)pvVar2 + 8) = pHVar4;
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pHVar4 = (Hop_Obj_t *)Vec_PtrEntry(p->vObjs,local_2c);
    iVar1 = Hop_ObjIsNode(pHVar4);
    if (iVar1 != 0) {
      pHVar5 = Hop_ObjChild0Hop(pHVar4);
      p1 = Hop_ObjChild1Hop(pHVar4);
      pHVar5 = Hop_And(p_local,pHVar5,p1);
      (pHVar4->field_1).pNext = pHVar5;
      Hop_ManConst1(p_local);
      Hop_Regular((pHVar4->field_1).pNext);
      if ((pHVar4->field_0).pData != (void *)0x0) {
        pHVar5 = Hop_Regular(*(Hop_Obj_t **)((long)(pHVar4->field_0).pData + 8));
        pHVar4 = Hop_Regular((pHVar4->field_1).pNext);
        (pHVar4->field_0).pData = pHVar5;
      }
    }
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vPos), local_2c < iVar1; local_2c = local_2c + 1) {
    pHVar4 = (Hop_Obj_t *)Vec_PtrEntry(p->vPos,local_2c);
    pHVar4 = Hop_ObjChild0Hop(pHVar4);
    Hop_ObjCreatePo(p_local,pHVar4);
  }
  iVar1 = Hop_ManCheck(p_local);
  if (iVar1 == 0) {
    printf("Abc_NtkHaigReconstruct: Check for History AIG has failed.\n");
    Hop_ManStop(p_local);
    p_local = (Hop_Man_t *)0x0;
  }
  return p_local;
}

Assistant:

Hop_Man_t * Abc_NtkHaigReconstruct( Hop_Man_t * p )
{ 
    Hop_Man_t * pNew;
    Hop_Obj_t * pObj;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
        pObj->pNext = NULL;
    // start the HOP package
    pNew = Hop_ManStart();
    pNew->vObjs = Vec_PtrAlloc( p->nCreated );
    Vec_PtrPush( pNew->vObjs, Hop_ManConst1(pNew) );
    // map the constant node
    Hop_ManConst1(p)->pNext = Hop_ManConst1(pNew);
    // map the CIs
    Hop_ManForEachPi( p, pObj, i )
        pObj->pNext = Hop_ObjCreatePi(pNew);
    // map the internal nodes
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( !Hop_ObjIsNode(pObj) )
            continue;
        pObj->pNext = Hop_And( pNew, Hop_ObjChild0Hop(pObj), Hop_ObjChild1Hop(pObj) );
//        assert( !Hop_IsComplement(pObj->pNext) );
        if ( Hop_ManConst1(pNew) == Hop_Regular(pObj->pNext) )
            Counter++;
        if ( pObj->pData ) // member of the class
            Hop_Regular(pObj->pNext)->pData = Hop_Regular(((Hop_Obj_t *)pObj->pData)->pNext);
    }
//    printf( " Counter = %d.\n", Counter );
    // transfer the POs
    Hop_ManForEachPo( p, pObj, i )
        Hop_ObjCreatePo( pNew, Hop_ObjChild0Hop(pObj) );
    // check the new manager
    if ( !Hop_ManCheck(pNew) )
    {
        printf( "Abc_NtkHaigReconstruct: Check for History AIG has failed.\n" );
        Hop_ManStop(pNew);
        return NULL;
    }
    return pNew;
}